

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O1

void __thiscall
randomx::AssemblyGeneratorX86::h_FDIV_M(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *puVar1;
  char *__s;
  char cVar2;
  size_t sVar3;
  
  instr->dst = instr->dst & 3;
  genAddressReg(this,instr,"eax");
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tcvtdq2pd ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"xmm12",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", qword ptr [",0xd);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"rsi",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"+rax]",5);
  cVar2 = (char)puVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tandps ",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"xmm12",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"xmm13",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\torps ",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"xmm12",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"xmm14",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tdivpd ",7);
  __s = *(char **)(regE + (ulong)instr->dst * 8);
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,__s,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"xmm12",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_FDIV_M(Instruction& instr, int i) {
		instr.dst %= RegisterCountFlt;
		genAddressReg(instr);
		asmCode << "\tcvtdq2pd " << tempRegx << ", qword ptr [" << regScratchpadAddr << "+rax]" << std::endl;
		asmCode << "\tandps " << tempRegx << ", " << mantissaMaskReg << std::endl;
		asmCode << "\torps " << tempRegx << ", " << exponentMaskReg << std::endl;
		asmCode << "\tdivpd " << regE[instr.dst] << ", " << tempRegx << std::endl;
		traceflt(instr);
	}